

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setParent_sys(QWidgetPrivate *this,QWidget *newparent,WindowFlags f)

{
  long lVar1;
  ulong uVar2;
  undefined1 *puVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  WindowType WVar7;
  Int IVar8;
  QWindow *pQVar9;
  pointer pQVar10;
  QWidget *pQVar11;
  QObject **ppQVar12;
  QDebug *o;
  byte bVar13;
  Int in_EDX;
  long in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWindow *childWindow;
  QObject *child;
  QObjectList *__range3;
  QWindow *newParentWindow;
  QWidget *parentWithWindow_1;
  bool explicitlyHidden;
  QWidget *parentWithWindow;
  bool destroyWindow;
  QScreen *targetScreen;
  bool wasCreated;
  QWidget *q;
  const_iterator __end3;
  const_iterator __begin3;
  WindowFlags oldFlags;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 uVar14;
  undefined1 uVar15;
  QWidget *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  byte bVar16;
  QWidgetPrivate *in_stack_ffffffffffffff10;
  QWidgetPrivate *in_stack_ffffffffffffff18;
  QWidgetPrivate *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  QScreen *p;
  undefined7 in_stack_ffffffffffffff58;
  long local_98;
  QFlagsStorageHelper<Qt::WindowType,_4> local_84;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QObject **local_48;
  const_iterator local_40;
  const_iterator local_38;
  Int local_30;
  Int local_2c;
  QFlagsStorageHelper<Qt::WindowType,_4> local_28;
  QFlagsStorageHelper<Qt::WindowType,_4> local_24;
  Int local_20;
  QFlagsStorage<Qt::WindowType> local_1c;
  QLoggingCategoryMacroHolder local_18 [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c.i = in_EDX;
  q_func(in_RDI);
  local_20 = (in_RDI->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i;
  bVar4 = QWidget::testAttribute
                    (in_stack_fffffffffffffef8,
                     CONCAT13(in_stack_fffffffffffffef7,
                              CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)));
  p = (QScreen *)0x0;
  local_98 = in_RSI;
  if ((in_RSI != 0) &&
     (WVar7 = QWidget::windowType((QWidget *)
                                  CONCAT17(in_stack_fffffffffffffef7,
                                           CONCAT16(in_stack_fffffffffffffef6,
                                                    CONCAT24(in_stack_fffffffffffffef4,
                                                             in_stack_fffffffffffffef0)))),
     WVar7 == Desktop)) {
    p = QWidget::screen((QWidget *)in_stack_ffffffffffffff18);
    local_98 = 0;
  }
  setWinId(in_stack_ffffffffffffff10,(WId)in_RDI);
  if ((local_98 == 0) &&
     (QFlags<Qt::WindowType>::operator|=((QFlags<Qt::WindowType> *)&local_1c,Window),
     *(long *)&in_RDI->field_0x10 != 0)) {
    QWidget::parentWidget((QWidget *)0x37e596);
    QWidget::window((QWidget *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    p = QWidget::screen((QWidget *)in_stack_ffffffffffffff18);
  }
  local_24.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       QFlags<Qt::WindowType>::operator&
                 ((QFlags<Qt::WindowType> *)
                  CONCAT17(in_stack_fffffffffffffef7,
                           CONCAT16(in_stack_fffffffffffffef6,
                                    CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))),
                  (WindowType)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
  bVar16 = 0;
  if (IVar8 != 0) {
    local_28.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)
                    CONCAT17(in_stack_fffffffffffffef7,
                             CONCAT16(in_stack_fffffffffffffef6,
                                      CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
                            ),(WindowType)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    bVar5 = QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_28);
    bVar16 = 0;
    if ((bVar5) && (bVar16 = 0, (bVar4 & 1) != 0)) {
      bVar5 = QWidget::testAttribute
                        (in_stack_fffffffffffffef8,
                         CONCAT13(in_stack_fffffffffffffef7,
                                  CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)));
      bVar16 = bVar5 ^ 0xff;
    }
  }
  bVar13 = bVar16 & 1;
  if (*(long *)&in_RDI->field_0x10 != local_98) {
    QObjectPrivate::setParent_helper((QObject *)in_RDI);
    pQVar9 = QWidget::windowHandle
                       ((QWidget *)
                        CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,
                                          CONCAT24(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0))));
    if (pQVar9 != (QWindow *)0x0) {
      pQVar9 = QWidget::windowHandle
                         ((QWidget *)
                          CONCAT17(in_stack_fffffffffffffef7,
                                   CONCAT16(in_stack_fffffffffffffef6,
                                            CONCAT24(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0))));
      local_2c = local_1c.i;
      QWindow::setFlags((QFlags_conflict1 *)pQVar9);
    }
    closestParentWidgetWithWindowHandle
              ((QWidgetPrivate *)CONCAT17(bVar16,in_stack_ffffffffffffff00));
    puVar3 = _local_18;
    if (bVar13 == 0) {
      local_30 = local_1c.i;
      uVar2 = (ulong)_local_18 >> 0x20;
      reparentWidgetWindows
                (in_stack_ffffffffffffff18,(QWidget *)in_stack_ffffffffffffff10,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84(uVar2,0));
      _local_18 = puVar3;
    }
    else {
      reparentWidgetWindowChildren(in_stack_ffffffffffffff20,(QWidget *)in_stack_ffffffffffffff18);
    }
  }
  bVar6 = isExplicitlyHidden((QWidgetPrivate *)
                             CONCAT17(in_stack_fffffffffffffef7,
                                      CONCAT16(in_stack_fffffffffffffef6,
                                               CONCAT24(in_stack_fffffffffffffef4,
                                                        in_stack_fffffffffffffef0))));
  if (bVar13 != 0) {
    bVar5 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37e718);
    if ((bVar5) &&
       (pQVar10 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37e72c),
       (*(ushort *)&pQVar10->field_0x7c >> 8 & 1) != 0)) {
      QWindowContainer::toplevelAboutToBeDestroyed
                ((QWidget *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))));
    }
    QWidget::windowHandle
              ((QWidget *)
               CONCAT17(in_stack_fffffffffffffef7,
                        CONCAT16(in_stack_fffffffffffffef6,
                                 CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))));
    QObject::children((QObject *)0x37e75c);
    bVar5 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x37e764);
    if (!bVar5) {
      pQVar11 = closestParentWidgetWithWindowHandle
                          ((QWidgetPrivate *)CONCAT17(bVar16,in_stack_ffffffffffffff00));
      if (pQVar11 == (QWidget *)0x0) {
        in_stack_fffffffffffffef8 = (QWidget *)0x0;
      }
      else {
        in_stack_fffffffffffffef8 =
             (QWidget *)
             QWidget::windowHandle
                       ((QWidget *)
                        CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,
                                          CONCAT24(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0))));
      }
      QWidget::windowHandle
                ((QWidget *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))));
      in_stack_ffffffffffffff20 = (QWidgetPrivate *)QObject::children((QObject *)0x37e7c8);
      local_38.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = QList<QObject_*>::begin
                           ((QList<QObject_*> *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,
                                              CONCAT24(in_stack_fffffffffffffef4,
                                                       in_stack_fffffffffffffef0))));
      local_40.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = QList<QObject_*>::end
                           ((QList<QObject_*> *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,
                                              CONCAT24(in_stack_fffffffffffffef4,
                                                       in_stack_fffffffffffffef0))));
      while( true ) {
        local_48 = local_40.i;
        bVar5 = QList<QObject_*>::const_iterator::operator!=(&local_38,local_40);
        if (!bVar5) break;
        ppQVar12 = QList<QObject_*>::const_iterator::operator*(&local_38);
        in_stack_ffffffffffffff18 = (QWidgetPrivate *)*ppQVar12;
        pQVar9 = qobject_cast<QWindow*>((QObject *)in_stack_fffffffffffffee8);
        if (pQVar9 != (QWindow *)0x0) {
          _local_18 = &DAT_aaaaaaaaaaaaaaaa;
          lcWidgetWindow();
          anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                     CONCAT17(in_stack_fffffffffffffef7,
                              CONCAT16(in_stack_fffffffffffffef6,
                                       CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                      )),in_stack_fffffffffffffee8);
          while (bVar5 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   (local_18), bVar5) {
            anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x37e8c3);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)CONCAT17(bVar16,in_stack_ffffffffffffff00),
                       (char *)in_stack_fffffffffffffef8,
                       CONCAT13(in_stack_fffffffffffffef7,
                                CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)),
                       (char *)in_stack_fffffffffffffee8,(char *)0x37e8dc);
            QMessageLogger::warning();
            o = QDebug::operator<<((QDebug *)in_RDI,
                                   (char *)CONCAT17(bVar6,in_stack_ffffffffffffff38));
            QDebug::QDebug(&local_58,o);
            ::operator<<((QDebug *)&local_50,(QWindow *)&local_58);
            QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT17(bVar6,in_stack_ffffffffffffff38));
            QDebug::operator<<((QDebug *)
                               CONCAT17(in_stack_fffffffffffffef7,
                                        CONCAT16(in_stack_fffffffffffffef6,
                                                 CONCAT24(in_stack_fffffffffffffef4,
                                                          in_stack_fffffffffffffef0))),
                               in_stack_fffffffffffffee8);
            QDebug::~QDebug(&local_50);
            QDebug::~QDebug(&local_58);
            QDebug::~QDebug(&local_60);
          }
          QWindow::setParent(pQVar9);
        }
        QList<QObject_*>::const_iterator::operator++(&local_38);
      }
    }
    QWidget::destroy((QWidget *)in_stack_ffffffffffffff20,
                     SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                     SUB81((ulong)in_stack_ffffffffffffff18 >> 0x30,0));
  }
  WVar7 = (WindowType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  adjustFlags((WindowFlags *)in_stack_ffffffffffffff20,(QWidget *)in_stack_ffffffffffffff18);
  (in_RDI->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i = local_1c.i;
  QWidget::setAttribute
            ((QWidget *)CONCAT17(bVar4,in_stack_ffffffffffffff58),
             (WidgetAttribute)((ulong)p >> 0x20),SUB81((ulong)p >> 0x18,0));
  QWidget::setAttribute
            ((QWidget *)CONCAT17(bVar4,in_stack_ffffffffffffff58),
             (WidgetAttribute)((ulong)p >> 0x20),SUB81((ulong)p >> 0x18,0));
  QWidget::setAttribute
            ((QWidget *)CONCAT17(bVar4,in_stack_ffffffffffffff58),
             (WidgetAttribute)((ulong)p >> 0x20),SUB81((ulong)p >> 0x18,0));
  uVar15 = false;
  if ((local_98 != 0) && (uVar14 = false, uVar15 = uVar14, (bVar4 & 1) != 0)) {
    bVar5 = QWidget::testAttribute
                      (in_stack_fffffffffffffef8,
                       (uint)CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4));
    in_stack_fffffffffffffef6 = true;
    uVar15 = in_stack_fffffffffffffef6;
    if (!bVar5) {
      local_84.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)
                      CONCAT17(uVar14,CONCAT16(1,CONCAT24(in_stack_fffffffffffffef4,
                                                          in_stack_fffffffffffffef0))),WVar7);
      IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
      in_stack_fffffffffffffef6 = IVar8 != 0;
      uVar15 = in_stack_fffffffffffffef6;
    }
  }
  if ((bool)uVar15 != false) {
    QWidget::createWinId
              ((QWidget *)
               CONCAT17(uVar15,CONCAT16(in_stack_fffffffffffffef6,
                                        CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ))));
  }
  bVar5 = QWidget::isWindow((QWidget *)
                            CONCAT17(uVar15,CONCAT16(in_stack_fffffffffffffef6,
                                                     CONCAT24(in_stack_fffffffffffffef4,
                                                              in_stack_fffffffffffffef0))));
  if ((((bVar5) || (local_98 == 0)) || (bVar5 = QWidget::isVisible((QWidget *)0x37eabd), bVar5)) ||
     ((bVar6 & 1) != 0)) {
    QWidget::setAttribute
              ((QWidget *)CONCAT17(bVar4,in_stack_ffffffffffffff58),
               (WidgetAttribute)((ulong)p >> 0x20),SUB81((ulong)p >> 0x18,0));
  }
  QWidget::setAttribute
            ((QWidget *)CONCAT17(bVar4,in_stack_ffffffffffffff58),
             (WidgetAttribute)((ulong)p >> 0x20),SUB81((ulong)p >> 0x18,0));
  if ((local_98 == 0) && (p != (QScreen *)0x0)) {
    bVar5 = QWidget::testAttribute
                      (in_stack_fffffffffffffef8,
                       CONCAT13(uVar15,CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)
                               ));
    if (bVar5) {
      pQVar9 = QWidget::windowHandle
                         ((QWidget *)
                          CONCAT17(uVar15,CONCAT16(in_stack_fffffffffffffef6,
                                                   CONCAT24(in_stack_fffffffffffffef4,
                                                            in_stack_fffffffffffffef0))));
      QWindow::setScreen((QScreen *)pQVar9);
    }
    else {
      topData((QWidgetPrivate *)
              CONCAT17(uVar15,CONCAT16(in_stack_fffffffffffffef6,
                                       CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                      )));
      QPointer<QScreen>::operator=
                ((QPointer<QScreen> *)
                 CONCAT17(uVar15,CONCAT16(in_stack_fffffffffffffef6,
                                          CONCAT24(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0))),p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setParent_sys(QWidget *newparent, Qt::WindowFlags f)
{
    Q_Q(QWidget);

    Qt::WindowFlags oldFlags = data.window_flags;
    bool wasCreated = q->testAttribute(Qt::WA_WState_Created);

    QScreen *targetScreen = nullptr;
    // Handle a request to move the widget to a particular screen
    if (newparent && newparent->windowType() == Qt::Desktop) {
        // make sure the widget is created on the same screen as the
        // programmer specified desktop widget
        targetScreen = newparent->screen();
        newparent = nullptr;
    }

    setWinId(0);

    if (!newparent) {
        f |= Qt::Window;
        if (parent)
            targetScreen = q->parentWidget()->window()->screen();
    }

    const bool destroyWindow = (
        // Reparenting top level to child
        (oldFlags & Qt::Window) && !(f & Qt::Window)
        // And we can dispose of the window
        && wasCreated && !q->testAttribute(Qt::WA_NativeWindow)
    );

    if (parent != newparent) {
        // Update object parent now, so we can resolve new parent window below
        QObjectPrivate::setParent_helper(newparent);

        if (q->windowHandle())
            q->windowHandle()->setFlags(f);

        // If the widget itself or any of its children have been created,
        // we need to reparent their QWindows as well.
        QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
        // But if the widget is about to be destroyed we must skip the
        // widget itself, and only reparent children.
        if (destroyWindow) {
            reparentWidgetWindowChildren(parentWithWindow);
        } else {
            // During reparentWidgetWindows() we need to know whether the reparented
            // QWindow should be a top level (with a transient parent) or not. This
            // widget has not updated its window flags yet, so we can't ask the widget
            // directly at that point. Nor can we use the QWindow flags, as unlike QWidgets
            // the QWindow flags always reflect Qt::Window, even for child windows. And
            // we can't use QWindow::isTopLevel() either, as that depends on the parent,
            // which we are in the process of updating. So we propagate the
            // new flags of the reparented window here.
            reparentWidgetWindows(parentWithWindow, f);
        }
    }

    bool explicitlyHidden = isExplicitlyHidden();

    if (destroyWindow) {
        if (extra && extra->hasWindowContainer)
            QWindowContainer::toplevelAboutToBeDestroyed(q);

        // There shouldn't be any QWindow children left, but if there
        // are, re-parent them now, before we destroy.
        if (!q->windowHandle()->children().isEmpty()) {
            QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
            QWindow *newParentWindow = parentWithWindow ? parentWithWindow->windowHandle() : nullptr;
            for (QObject *child : q->windowHandle()->children()) {
                if (QWindow *childWindow = qobject_cast<QWindow *>(child)) {
                    qCWarning(lcWidgetWindow) << "Reparenting" << childWindow
                                              << "before destroying" << this;
                    childWindow->setParent(newParentWindow);
                }
            }
        }

        // We have reparented any child windows of the widget we are
        // about to destroy to the new parent window handle, so we can
        // safely destroy this widget without destroying sub windows.
        q->destroy(true, false);
    }

    adjustFlags(f, q);
    data.window_flags = f;
    q->setAttribute(Qt::WA_WState_Created, false);
    q->setAttribute(Qt::WA_WState_Visible, false);
    q->setAttribute(Qt::WA_WState_Hidden, false);

    if (newparent && wasCreated && (q->testAttribute(Qt::WA_NativeWindow) || (f & Qt::Window)))
        q->createWinId();

    if (q->isWindow() || (!newparent || newparent->isVisible()) || explicitlyHidden)
        q->setAttribute(Qt::WA_WState_Hidden);
    q->setAttribute(Qt::WA_WState_ExplicitShowHide, explicitlyHidden);

    // move the window to the selected screen
    if (!newparent && targetScreen) {
        // only if it is already created
        if (q->testAttribute(Qt::WA_WState_Created))
            q->windowHandle()->setScreen(targetScreen);
        else
            topData()->initialScreen = targetScreen;
    }
}